

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderDepthRangeTest::init(ShaderDepthRangeTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string *ctx_00;
  ostringstream src;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    poVar2 = std::operator<<((ostream *)local_190,"attribute highp vec4 a_position;\n");
    std::operator<<(poVar2,"varying mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  poVar2 = std::operator<<((ostream *)local_190,"\t");
  pcVar3 = "gl_FragColor";
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar3 = "v_color";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,
                  " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n"
                 );
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<((ostream *)local_190,"\tgl_Position = a_position;\n");
  }
  std::operator<<((ostream *)local_190,"}\n");
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,init::defaultVertSrc,&local_1b1);
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,init::defaultFragSrc,&local_1b2);
  }
  else {
    std::__cxx11::stringbuf::str();
  }
  ctx_00 = local_1b0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  iVar1 = std::__cxx11::ostringstream::~ostringstream(local_190);
  return iVar1;
}

Assistant:

void init (void)
	{
		static const char* defaultVertSrc =
			"attribute highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n";
		static const char* defaultFragSrc =
			"varying mediump vec4 v_color;\n\n"
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = v_color;\n"
			"}\n";

		// Construct shader.
		std::ostringstream src;
		if (m_isVertexCase)
			src << "attribute highp vec4 a_position;\n"
				<< "varying mediump vec4 v_color;\n";

		src << "void main (void)\n{\n";
		src << "\t" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n";

		if (m_isVertexCase)
			src << "\tgl_Position = a_position;\n";

		src << "}\n";

		m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
		m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

		gls::ShaderRenderCase::init();
	}